

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

uint16_t icu_63::expandName(UCharNames *names,uint8_t *name,uint16_t nameLength,
                           UCharNameChoice nameChoice,char *buffer,uint16_t bufferLength)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint16_t uVar4;
  byte *pbVar5;
  UCharNameChoice local_5c;
  byte *local_58;
  uint8_t *tokenString;
  int fieldIndex;
  uint8_t c;
  uint8_t *tokenStrings;
  uint16_t bufferPos;
  uint16_t tokenCount;
  uint16_t token;
  uint16_t *tokens;
  byte *pbStack_28;
  uint16_t bufferLength_local;
  char *buffer_local;
  UCharNameChoice nameChoice_local;
  uint16_t nameLength_local;
  uint8_t *name_local;
  UCharNames *names_local;
  
  uVar2 = (ushort)names[1].tokenStringOffset;
  tokenStrings._2_2_ = 0;
  uVar3 = names->tokenStringOffset;
  tokens._6_2_ = bufferLength;
  pbStack_28 = (byte *)buffer;
  buffer_local._6_2_ = nameLength;
  _nameChoice_local = name;
  if ((nameChoice != U_UNICODE_CHAR_NAME) &&
     (buffer_local._6_2_ = nameLength, _nameChoice_local = name, nameChoice != U_EXTENDED_CHAR_NAME)
     ) {
    if ((uVar2 < 0x3c) || ((short)names[8].groupStringOffset == -1)) {
      local_5c = nameChoice;
      if (nameChoice == U_CHAR_NAME_CHOICE_COUNT) {
        local_5c = U_EXTENDED_CHAR_NAME;
      }
      tokenString._0_4_ = local_5c;
      buffer_local._6_2_ = nameLength;
      _nameChoice_local = name;
LAB_003e13e6:
      do {
        if (buffer_local._6_2_ != 0) {
          buffer_local._6_2_ = buffer_local._6_2_ - 1;
          pbVar5 = _nameChoice_local + 1;
          bVar1 = *_nameChoice_local;
          _nameChoice_local = pbVar5;
          if (bVar1 != 0x3b) goto LAB_003e13e6;
        }
        tokenString._0_4_ = (UCharNameChoice)tokenString - U_UNICODE_10_CHAR_NAME;
      } while (0 < (int)(UCharNameChoice)tokenString);
    }
    else {
      buffer_local._6_2_ = 0;
      _nameChoice_local = name;
    }
  }
  while (buffer_local._6_2_ != 0) {
    pbVar5 = _nameChoice_local + 1;
    bVar1 = *_nameChoice_local;
    if (bVar1 < uVar2) {
      tokenStrings._6_2_ = *(ushort *)((long)&names[1].tokenStringOffset + (ulong)bVar1 * 2 + 2);
      uVar4 = buffer_local._6_2_ - 1;
      if (tokenStrings._6_2_ == 0xfffe) {
        tokenStrings._6_2_ =
             *(ushort *)
              ((long)&names[1].tokenStringOffset + (long)(int)(uint)CONCAT11(bVar1,*pbVar5) * 2 + 2)
        ;
        uVar4 = buffer_local._6_2_ - 2;
        pbVar5 = _nameChoice_local + 2;
      }
      _nameChoice_local = pbVar5;
      buffer_local._6_2_ = uVar4;
      if (tokenStrings._6_2_ == 0xffff) {
        if (bVar1 == 0x3b) {
          if (((tokenStrings._2_2_ != 0) || (nameChoice != U_EXTENDED_CHAR_NAME)) ||
             ((0x3b < uVar2 && ((short)names[8].groupStringOffset != -1)))) break;
        }
        else {
          if (tokens._6_2_ != 0) {
            *pbStack_28 = bVar1;
            tokens._6_2_ = tokens._6_2_ - 1;
            pbStack_28 = pbStack_28 + 1;
          }
          tokenStrings._2_2_ = tokenStrings._2_2_ + 1;
        }
      }
      else {
        local_58 = (byte *)((long)&names->tokenStringOffset +
                           (long)(int)(uint)tokenStrings._6_2_ + (ulong)uVar3);
        while( true ) {
          if (*local_58 == 0) break;
          if (tokens._6_2_ != 0) {
            *pbStack_28 = *local_58;
            tokens._6_2_ = tokens._6_2_ - 1;
            pbStack_28 = pbStack_28 + 1;
          }
          tokenStrings._2_2_ = tokenStrings._2_2_ + 1;
          local_58 = local_58 + 1;
        }
      }
    }
    else {
      if (bVar1 == 0x3b) break;
      if (tokens._6_2_ != 0) {
        *pbStack_28 = bVar1;
        tokens._6_2_ = tokens._6_2_ - 1;
        pbStack_28 = pbStack_28 + 1;
      }
      tokenStrings._2_2_ = tokenStrings._2_2_ + 1;
      buffer_local._6_2_ = buffer_local._6_2_ - 1;
      _nameChoice_local = pbVar5;
    }
  }
  if (tokens._6_2_ != 0) {
    *pbStack_28 = 0;
  }
  return tokenStrings._2_2_;
}

Assistant:

static uint16_t
expandName(UCharNames *names,
           const uint8_t *name, uint16_t nameLength, UCharNameChoice nameChoice,
           char *buffer, uint16_t bufferLength) {
    uint16_t *tokens=(uint16_t *)names+8;
    uint16_t token, tokenCount=*tokens++, bufferPos=0;
    uint8_t *tokenStrings=(uint8_t *)names+names->tokenStringOffset;
    uint8_t c;

    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        /*
         * skip the modern name if it is not requested _and_
         * if the semicolon byte value is a character, not a token number
         */
        if((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
            int fieldIndex= nameChoice==U_ISO_COMMENT ? 2 : nameChoice;
            do {
                while(nameLength>0) {
                    --nameLength;
                    if(*name++==';') {
                        break;
                    }
                }
            } while(--fieldIndex>0);
        } else {
            /*
             * the semicolon byte value is a token number, therefore
             * only modern names are stored in unames.dat and there is no
             * such requested alternate name here
             */
            nameLength=0;
        }
    }

    /* write each letter directly, and write a token word per token */
    while(nameLength>0) {
        --nameLength;
        c=*name++;

        if(c>=tokenCount) {
            if(c!=';') {
                /* implicit letter */
                WRITE_CHAR(buffer, bufferLength, bufferPos, c);
            } else {
                /* finished */
                break;
            }
        } else {
            token=tokens[c];
            if(token==(uint16_t)(-2)) {
                /* this is a lead byte for a double-byte token */
                token=tokens[c<<8|*name++];
                --nameLength;
            }
            if(token==(uint16_t)(-1)) {
                if(c!=';') {
                    /* explicit letter */
                    WRITE_CHAR(buffer, bufferLength, bufferPos, c);
                } else {
                    /* stop, but skip the semicolon if we are seeking
                       extended names and there was no 2.0 name but there
                       is a 1.0 name. */
                    if(!bufferPos && nameChoice == U_EXTENDED_CHAR_NAME) {
                        if ((uint8_t)';'>=tokenCount || tokens[(uint8_t)';']==(uint16_t)(-1)) {
                            continue;
                        }
                    }
                    /* finished */
                    break;
                }
            } else {
                /* write token word */
                uint8_t *tokenString=tokenStrings+token;
                while((c=*tokenString++)!=0) {
                    WRITE_CHAR(buffer, bufferLength, bufferPos, c);
                }
            }
        }
    }

    /* zero-terminate */
    if(bufferLength>0) {
        *buffer=0;
    }

    return bufferPos;
}